

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenFaceNormalsProcess.cpp
# Opt level: O3

void __thiscall Assimp::GenFaceNormalsProcess::Execute(GenFaceNormalsProcess *this,aiScene *pScene)

{
  byte bVar1;
  bool bVar2;
  Logger *pLVar3;
  runtime_error *this_00;
  byte bVar4;
  ulong uVar5;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"GenFaceNormalsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,"");
    std::runtime_error::runtime_error(this_00,(string *)local_48);
    *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pScene->mNumMeshes != 0) {
    uVar5 = 0;
    bVar1 = 0;
    do {
      bVar4 = bVar1;
      bVar2 = GenMeshFaceNormals(this,pScene->mMeshes[uVar5]);
      uVar5 = uVar5 + 1;
      bVar1 = bVar4 | bVar2;
    } while (uVar5 < pScene->mNumMeshes);
    if (bVar4 != 0 || bVar2) {
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,"GenFaceNormalsProcess finished. Face normals have been calculated");
      return;
    }
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"GenFaceNormalsProcess finished. Normals are already there");
  return;
}

Assistant:

void GenFaceNormalsProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("GenFaceNormalsProcess begin");

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");
    }

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {
        if(this->GenMeshFaceNormals( pScene->mMeshes[a])) {
            bHas = true;
        }
    }
    if (bHas)   {
        ASSIMP_LOG_INFO("GenFaceNormalsProcess finished. "
            "Face normals have been calculated");
    } else {
        ASSIMP_LOG_DEBUG("GenFaceNormalsProcess finished. "
            "Normals are already there");
    }
}